

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * __thiscall cmake::StripExtension(string *__return_storage_ptr__,cmake *this,string *file)

{
  bool bVar1;
  long lVar2;
  basic_string_view<char,_std::char_traits<char>_> ext;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  lVar2 = std::__cxx11::string::rfind((char)file,0x2e);
  if (lVar2 != -1) {
    local_30._M_str = (file->_M_dataplus)._M_p;
    local_30._M_len = file->_M_string_length;
    ext = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_30,lVar2 + 1,0xffffffffffffffff);
    bVar1 = IsAKnownExtension(this,ext);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::StripExtension(const std::string& file) const
{
  auto dotpos = file.rfind('.');
  if (dotpos != std::string::npos) {
#if defined(_WIN32) || defined(__APPLE__)
    auto ext = cmSystemTools::LowerCase(file.substr(dotpos + 1));
#else
    auto ext = cm::string_view(file).substr(dotpos + 1);
#endif
    if (this->IsAKnownExtension(ext)) {
      return file.substr(0, dotpos);
    }
  }
  return file;
}